

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

char * Curl_copy_header_value(char *header)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char *__s;
  char *pcVar4;
  
  pcVar4 = header + -1;
  for (; (cVar1 = *header, cVar1 != '\0' && (cVar1 != ':')); header = header + 1) {
    pcVar4 = pcVar4 + 1;
  }
  __s = header + (cVar1 != '\0');
  pcVar4 = pcVar4 + (cVar1 != '\0');
  while( true ) {
    cVar1 = *__s;
    if (((cVar1 != '\t') && (cVar1 != ' ')) && ((cVar1 == '\0' || (3 < (byte)(cVar1 - 10U)))))
    break;
    __s = __s + 1;
    pcVar4 = pcVar4 + 1;
  }
  pcVar2 = strchr(__s,0xd);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strchr(__s,10);
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(__s);
      pcVar2 = __s + sVar3;
    }
  }
  for (; __s < pcVar2; pcVar2 = pcVar2 + -1) {
    cVar1 = *pcVar2;
    if (((cVar1 != '\t') && (cVar1 != ' ')) && (3 < (byte)(cVar1 - 10U))) break;
  }
  pcVar4 = (char *)Curl_memdup0(__s,(long)pcVar2 - (long)pcVar4);
  return pcVar4;
}

Assistant:

char *Curl_copy_header_value(const char *header)
{
  const char *start;
  const char *end;
  size_t len;

  /* Find the end of the header name */
  while(*header && (*header != ':'))
    ++header;

  if(*header)
    /* Skip over colon */
    ++header;

  /* Find the first non-space letter */
  start = header;
  while(*start && ISSPACE(*start))
    start++;

  /* data is in the host encoding so
     use '\r' and '\n' instead of 0x0d and 0x0a */
  end = strchr(start, '\r');
  if(!end)
    end = strchr(start, '\n');
  if(!end)
    end = strchr(start, '\0');
  if(!end)
    return NULL;

  /* skip all trailing space letters */
  while((end > start) && ISSPACE(*end))
    end--;

  /* get length of the type */
  len = end - start + 1;

  return Curl_memdup0(start, len);
}